

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QCborKnownTags tag)

{
  char *pcVar1;
  char *pcVar2;
  storage_type *in_RCX;
  int in_EDX;
  undefined4 in_register_00000034;
  QDebug *dbg_00;
  QString *this;
  Stream *pSVar3;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QDebugStateSaver local_50;
  QString local_48;
  long local_30;
  
  dbg_00 = (QDebug *)CONCAT44(in_register_00000034,tag);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,dbg_00);
  pcVar2 = qt_cbor_tag_id((long)in_EDX);
  pSVar3 = dbg_00->stream;
  pSVar3->space = false;
  if (pcVar2 == (char *)0x0) {
    ba_01.m_data = in_RCX;
    ba_01.m_size = (qsizetype)"QCborKnownTags(";
    QString::fromUtf8(&local_48,(QString *)0xf,ba_01);
    QTextStream::operator<<(&pSVar3->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pSVar3 = dbg_00->stream;
    if (pSVar3->space == true) {
      QTextStream::operator<<(&pSVar3->ts,' ');
      pSVar3 = dbg_00->stream;
    }
    QTextStream::operator<<(&pSVar3->ts,in_EDX);
    pSVar3 = dbg_00->stream;
    if (pSVar3->space == true) {
      QTextStream::operator<<(&pSVar3->ts,' ');
      pSVar3 = dbg_00->stream;
    }
    QTextStream::operator<<(&pSVar3->ts,')');
    pSVar3 = dbg_00->stream;
    if (pSVar3->space != true) goto LAB_002e533c;
  }
  else {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"QCborKnownTags::";
    QString::fromUtf8(&local_48,(QString *)0x10,ba);
    QTextStream::operator<<(&pSVar3->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pSVar3 = dbg_00->stream;
    if (pSVar3->space == true) {
      QTextStream::operator<<(&pSVar3->ts,' ');
      pSVar3 = dbg_00->stream;
    }
    this = (QString *)0xffffffffffffffff;
    do {
      pcVar1 = pcVar2 + 1 + (long)this;
      this = (QString *)((long)&(this->d).d + 1);
    } while (*pcVar1 != '\0');
    ba_00.m_data = in_RCX;
    ba_00.m_size = (qsizetype)pcVar2;
    QString::fromUtf8(&local_48,this,ba_00);
    QTextStream::operator<<(&pSVar3->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pSVar3 = dbg_00->stream;
    if (pSVar3->space == false) goto LAB_002e533c;
  }
  QTextStream::operator<<(&pSVar3->ts,' ');
  pSVar3 = dbg_00->stream;
LAB_002e533c:
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar3;
  pSVar3->ref = pSVar3->ref + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, QCborKnownTags tag)
{
    QDebugStateSaver saver(dbg);
    const char *id = qt_cbor_tag_id(QCborTag(int(tag)));
    if (id)
        return dbg.nospace() << "QCborKnownTags::" << id;

    return dbg.nospace() << "QCborKnownTags(" << int(tag) << ')';
}